

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O3

void __thiscall
testing::internal::MatcherBase<const_bool_&>::~MatcherBase(MatcherBase<const_bool_&> *this)

{
  SharedPayloadBase *pSVar1;
  
  (this->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0014da58;
  if ((this->vtable_ != (VTable *)0x0) &&
     (this->vtable_->shared_destroy != (_func_void_SharedPayloadBase_ptr *)0x0)) {
    pSVar1 = (this->buffer_).shared;
    LOCK();
    (pSVar1->ref).super___atomic_base<int>._M_i = (pSVar1->ref).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pSVar1->ref).super___atomic_base<int>._M_i == 0) {
      (*this->vtable_->shared_destroy)((SharedPayloadBase *)(this->buffer_).ptr);
    }
  }
  operator_delete(this,0x18);
  return;
}

Assistant:

~MatcherBase() override { Destroy(); }